

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtoolbutton.cpp
# Opt level: O0

void QToolButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  ToolButtonPopupMode *pTVar1;
  bool bVar2;
  ToolButtonPopupMode TVar3;
  QMetaType QVar4;
  ulong uVar5;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QToolButton *_t;
  undefined4 in_stack_ffffffffffffff68;
  ToolButtonPopupMode in_stack_ffffffffffffff6c;
  QToolButton *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  ArrowType type;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  QToolButton *in_stack_ffffffffffffffa0;
  QMetaType local_28;
  QMetaTypeInterface *local_20;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  type = (ArrowType)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      triggered((QToolButton *)0x70b82a,
                (QAction *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      break;
    case 1:
      showMenu(in_stack_ffffffffffffff70);
      break;
    case 2:
      setToolButtonStyle((QToolButton *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),type);
      break;
    case 3:
      setDefaultAction(in_stack_ffffffffffffffa0,(QAction *)_v_1);
    }
  }
  if (in_ESI == 7) {
    in_stack_ffffffffffffff84 = in_EDX;
    if (in_EDX == 0) {
      if (**(int **)(in_RCX + 8) == 0) {
        local_20 = (QMetaTypeInterface *)QMetaType::fromType<QAction*>();
        **(undefined8 **)in_RCX = local_20;
      }
      else {
        memset(&local_18,0,8);
        QMetaType::QMetaType(&local_18);
        **(undefined8 **)in_RCX = local_18.d_ptr;
      }
    }
    else if (in_EDX == 3) {
      if (**(int **)(in_RCX + 8) == 0) {
        QVar4 = QMetaType::fromType<QAction*>();
        **(undefined8 **)in_RCX = QVar4.d_ptr;
      }
      else {
        memset(&local_28,0,8);
        QMetaType::QMetaType(&local_28);
        **(undefined8 **)in_RCX = local_28.d_ptr;
      }
    }
    else {
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
      **(undefined8 **)in_RCX = local_10.d_ptr;
    }
  }
  if ((in_ESI != 5) ||
     (bVar2 = QtMocHelpers::indexOfMethod<void(QToolButton::*)(QAction*)>
                        (in_RCX,(void **)triggered,0,0), !bVar2)) {
    if (in_ESI == 1) {
      pTVar1 = *(ToolButtonPopupMode **)in_RCX;
      uVar5 = (ulong)in_EDX;
      switch(uVar5) {
      case 0:
        TVar3 = popupMode(in_stack_ffffffffffffff70);
        *pTVar1 = TVar3;
        break;
      case 1:
        TVar3 = toolButtonStyle(in_stack_ffffffffffffff70);
        *pTVar1 = TVar3;
        break;
      case 2:
        bVar2 = autoRaise(in_stack_ffffffffffffff70);
        *(bool *)pTVar1 = bVar2;
        break;
      case 3:
        TVar3 = arrowType(in_stack_ffffffffffffff70);
        *pTVar1 = TVar3;
      }
      type = (ArrowType)(uVar5 >> 0x20);
    }
    if (in_ESI == 2) {
      switch((QToolButton *)(ulong)in_EDX) {
      case (QToolButton *)0x0:
        setPopupMode((QToolButton *)(ulong)in_EDX,in_stack_ffffffffffffff6c);
        break;
      case (QToolButton *)0x1:
        setToolButtonStyle((QToolButton *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),type);
        break;
      case (QToolButton *)0x2:
        setAutoRaise((QToolButton *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     SUB41(type >> 0x18,0));
        break;
      case (QToolButton *)0x3:
        setArrowType((QToolButton *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     type);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QToolButton *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->triggered((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 1: _t->showMenu(); break;
        case 2: _t->setToolButtonStyle((*reinterpret_cast< std::add_pointer_t<Qt::ToolButtonStyle>>(_a[1]))); break;
        case 3: _t->setDefaultAction((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QToolButton::*)(QAction * )>(_a, &QToolButton::triggered, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<ToolButtonPopupMode*>(_v) = _t->popupMode(); break;
        case 1: *reinterpret_cast<Qt::ToolButtonStyle*>(_v) = _t->toolButtonStyle(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->autoRaise(); break;
        case 3: *reinterpret_cast<Qt::ArrowType*>(_v) = _t->arrowType(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setPopupMode(*reinterpret_cast<ToolButtonPopupMode*>(_v)); break;
        case 1: _t->setToolButtonStyle(*reinterpret_cast<Qt::ToolButtonStyle*>(_v)); break;
        case 2: _t->setAutoRaise(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setArrowType(*reinterpret_cast<Qt::ArrowType*>(_v)); break;
        default: break;
        }
    }
}